

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O1

WebPMux * WebPMuxCreateInternal(WebPData *bitstream,int copy_data,int version)

{
  ulong riff_size;
  uint32_t uVar1;
  int *piVar2;
  ulong uVar3;
  bool bVar4;
  WebPMuxError WVar5;
  WebPChunkId id;
  int iVar6;
  WebPMux *mux;
  WebPMuxImage *wpi;
  WebPChunk **ppWVar7;
  WebPChunk ***chunk_list;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  size_t data_size;
  WebPChunk chunk;
  WebPChunk **chunk_list_ends [11];
  int *local_c8;
  WebPChunk local_c0;
  WebPChunk ***local_a0;
  WebPChunk **local_98;
  WebPChunk **local_90;
  WebPChunk **local_88 [11];
  
  local_88[8] = (WebPChunk **)0x0;
  local_88[9] = (WebPChunk **)0x0;
  local_88[6] = (WebPChunk **)0x0;
  local_88[7] = (WebPChunk **)0x0;
  local_88[4] = (WebPChunk **)0x0;
  local_88[5] = (WebPChunk **)0x0;
  local_88[2] = (WebPChunk **)0x0;
  local_88[3] = (WebPChunk **)0x0;
  local_88[0] = (WebPChunk **)0x0;
  local_88[1] = (WebPChunk **)0x0;
  local_88[10] = (WebPChunk **)0x0;
  ChunkInit(&local_c0);
  if (bitstream == (WebPData *)0x0 || (version & 0xffffff00U) != 0x100) {
    return (WebPMux *)0x0;
  }
  piVar2 = (int *)bitstream->bytes;
  uVar3 = bitstream->size;
  if (uVar3 < 0x14 || piVar2 == (int *)0x0) {
    return (WebPMux *)0x0;
  }
  if (*piVar2 != 0x46464952) {
    return (WebPMux *)0x0;
  }
  if (piVar2[2] != 0x50424557) {
    return (WebPMux *)0x0;
  }
  mux = WebPNewInternal(0x108);
  if (mux == (WebPMux *)0x0) {
    return (WebPMux *)0x0;
  }
  uVar1 = piVar2[3];
  if ((((uVar1 == 0x20385056) || (uVar1 == 0x4c385056)) || (uVar1 == 0x58385056)) &&
     ((uint)piVar2[1] < 0xfffffff7)) {
    uVar10 = (ulong)(piVar2[1] + 1U & 0xfffffffe);
    riff_size = uVar10 + 8;
    if (riff_size <= uVar3) {
      uVar10 = uVar10 + 0x10;
      if (uVar3 < uVar10) {
        uVar10 = uVar3;
      }
      wpi = (WebPMuxImage *)WebPSafeMalloc(1,0x38);
      if (wpi != (WebPMuxImage *)0x0) {
        local_c8 = piVar2 + 3;
        data_size = uVar10 - 0xc;
        MuxImageInit(wpi);
        local_90 = &wpi->img_;
        local_98 = &wpi->alpha_;
        do {
          if (local_c8 == (int *)((long)piVar2 + uVar10)) {
            if ((wpi->is_partial_ == 0) && (WVar5 = MuxValidate(mux), WVar5 == WEBP_MUX_OK)) {
              MuxImageDelete(wpi);
              return mux;
            }
            break;
          }
          WVar5 = ChunkVerifyAndAssign(&local_c0,(uint8_t *)local_c8,data_size,riff_size,copy_data);
          if (WVar5 == WEBP_MUX_OK) {
            uVar8 = (int)local_c0.data_.size + 1U & 0xfffffffe;
            id = ChunkGetIdFromTag(local_c0.tag_);
            if (id == WEBP_CHUNK_ANMF) {
              if ((wpi->is_partial_ == 0) &&
                 (iVar6 = MuxImageParse(&local_c0,copy_data,wpi), iVar6 != 0)) {
                ChunkRelease(&local_c0);
LAB_0010704a:
                WVar5 = MuxImagePush(wpi,&mux->images_);
                if (WVar5 == WEBP_MUX_OK) {
                  MuxImageInit(wpi);
                  goto LAB_001070f0;
                }
              }
LAB_001070ba:
              bVar4 = false;
            }
            else {
              if (id == WEBP_CHUNK_IMAGE) {
                WVar5 = ChunkSetHead(&local_c0,local_90);
                if (WVar5 == WEBP_MUX_OK) {
                  iVar6 = MuxImageFinalize(wpi);
                  if (iVar6 != 0) {
                    wpi->is_partial_ = 0;
                    goto LAB_0010704a;
                  }
                  goto LAB_001070ba;
                }
              }
              else if (id == WEBP_CHUNK_ALPHA) {
                if (*local_98 == (WebPChunk *)0x0) {
                  WVar5 = ChunkSetHead(&local_c0,local_98);
                  if (WVar5 != WEBP_MUX_OK) goto LAB_001070ba;
                  wpi->is_partial_ = 1;
LAB_001070f0:
                  lVar9 = (ulong)uVar8 + 8;
                  local_c8 = (int *)((long)local_c8 + lVar9);
                  data_size = data_size - lVar9;
                  ChunkInit(&local_c0);
                  bVar4 = true;
                  goto LAB_0010710c;
                }
              }
              else if (wpi->is_partial_ == 0) {
                chunk_list = local_88 + id;
                if (*chunk_list == (WebPChunk **)0x0) {
                  local_a0 = chunk_list;
                  ppWVar7 = MuxGetChunkListFromId(mux,id);
                  *local_a0 = ppWVar7;
                  chunk_list = local_a0;
                }
                WVar5 = ChunkAppend(&local_c0,chunk_list);
                if (WVar5 == WEBP_MUX_OK) {
                  if (id == WEBP_CHUNK_VP8X) {
                    if (uVar8 < 10) goto LAB_001070ba;
                    mux->canvas_width_ =
                         (uint)*(ushort *)(local_c8 + 3) +
                         (uint)*(byte *)((long)local_c8 + 0xe) * 0x10000 + 1;
                    mux->canvas_height_ =
                         (uint)*(ushort *)((long)local_c8 + 0xf) +
                         (uint)*(byte *)((long)local_c8 + 0x11) * 0x10000 + 1;
                  }
                  goto LAB_001070f0;
                }
              }
              bVar4 = false;
            }
          }
          else {
            bVar4 = false;
          }
LAB_0010710c:
        } while (bVar4);
        goto LAB_0010711e;
      }
    }
  }
  wpi = (WebPMuxImage *)0x0;
LAB_0010711e:
  ChunkRelease(&local_c0);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return (WebPMux *)0x0;
}

Assistant:

WebPMux* WebPMuxCreateInternal(const WebPData* bitstream, int copy_data,
                               int version) {
  size_t riff_size;
  uint32_t tag;
  const uint8_t* end;
  WebPMux* mux = NULL;
  WebPMuxImage* wpi = NULL;
  const uint8_t* data;
  size_t size;
  WebPChunk chunk;
  // Stores the end of the chunk lists so that it is faster to append data to
  // their ends.
  WebPChunk** chunk_list_ends[WEBP_CHUNK_NIL + 1] = { NULL };
  ChunkInit(&chunk);

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_MUX_ABI_VERSION)) {
    return NULL;  // version mismatch
  }
  if (bitstream == NULL) return NULL;

  data = bitstream->bytes;
  size = bitstream->size;

  if (data == NULL) return NULL;
  if (size < RIFF_HEADER_SIZE + CHUNK_HEADER_SIZE) return NULL;
  if (GetLE32(data + 0) != MKFOURCC('R', 'I', 'F', 'F') ||
      GetLE32(data + CHUNK_HEADER_SIZE) != MKFOURCC('W', 'E', 'B', 'P')) {
    return NULL;
  }

  mux = WebPMuxNew();
  if (mux == NULL) return NULL;

  tag = GetLE32(data + RIFF_HEADER_SIZE);
  if (tag != kChunks[IDX_VP8].tag &&
      tag != kChunks[IDX_VP8L].tag &&
      tag != kChunks[IDX_VP8X].tag) {
    goto Err;  // First chunk should be VP8, VP8L or VP8X.
  }

  riff_size = GetLE32(data + TAG_SIZE);
  if (riff_size > MAX_CHUNK_PAYLOAD) goto Err;

  // Note this padding is historical and differs from demux.c which does not
  // pad the file size.
  riff_size = SizeWithPadding(riff_size);
  if (riff_size < CHUNK_HEADER_SIZE) goto Err;
  if (riff_size > size) goto Err;
  // There's no point in reading past the end of the RIFF chunk.
  if (size > riff_size + CHUNK_HEADER_SIZE) {
    size = riff_size + CHUNK_HEADER_SIZE;
  }

  end = data + size;
  data += RIFF_HEADER_SIZE;
  size -= RIFF_HEADER_SIZE;

  wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*wpi));
  if (wpi == NULL) goto Err;
  MuxImageInit(wpi);

  // Loop over chunks.
  while (data != end) {
    size_t data_size;
    WebPChunkId id;
    if (ChunkVerifyAndAssign(&chunk, data, size, riff_size,
                             copy_data) != WEBP_MUX_OK) {
      goto Err;
    }
    data_size = ChunkDiskSize(&chunk);
    id = ChunkGetIdFromTag(chunk.tag_);
    switch (id) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha_ != NULL) goto Err;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&chunk, &wpi->alpha_) != WEBP_MUX_OK) goto Err;
        wpi->is_partial_ = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (ChunkSetHead(&chunk, &wpi->img_) != WEBP_MUX_OK) goto Err;
        if (!MuxImageFinalize(wpi)) goto Err;
        wpi->is_partial_ = 0;  // wpi is completely filled.
 PushImage:
        // Add this to mux->images_ list.
        if (MuxImagePush(wpi, &mux->images_) != WEBP_MUX_OK) goto Err;
        MuxImageInit(wpi);  // Reset for reading next image.
        break;
      case WEBP_CHUNK_ANMF:
        if (wpi->is_partial_) goto Err;  // Previous wpi is still incomplete.
        if (!MuxImageParse(&chunk, copy_data, wpi)) goto Err;
        ChunkRelease(&chunk);
        goto PushImage;
      default:  // A non-image chunk.
        if (wpi->is_partial_) goto Err;  // Encountered a non-image chunk before
                                         // getting all chunks of an image.
        if (chunk_list_ends[id] == NULL) {
          chunk_list_ends[id] =
              MuxGetChunkListFromId(mux, id);  // List to add this chunk.
        }
        if (ChunkAppend(&chunk, &chunk_list_ends[id]) != WEBP_MUX_OK) goto Err;
        if (id == WEBP_CHUNK_VP8X) {  // grab global specs
          if (data_size < CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE) goto Err;
          mux->canvas_width_ = GetLE24(data + 12) + 1;
          mux->canvas_height_ = GetLE24(data + 15) + 1;
        }
        break;
    }
    data += data_size;
    size -= data_size;
    ChunkInit(&chunk);
  }

  // Incomplete image.
  if (wpi->is_partial_) goto Err;

  // Validate mux if complete.
  if (MuxValidate(mux) != WEBP_MUX_OK) goto Err;

  MuxImageDelete(wpi);
  return mux;  // All OK;

 Err:  // Something bad happened.
  ChunkRelease(&chunk);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return NULL;
}